

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_t.cpp
# Opt level: O0

dictionary_t * __thiscall deci::dictionary_t::operator=(dictionary_t *this,dictionary_t *copy)

{
  bool bVar1;
  int iVar2;
  reference ppVar3;
  size_type __n;
  reference pvVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pair<deci::value_t_*,_deci::value_t_*> local_88;
  value_t *local_78;
  value_t *value;
  value_t *key;
  value_type el_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  storage_t *__range2_1;
  pair<deci::value_t_*const,_deci::value_t_*> el;
  iterator __end2;
  iterator __begin2;
  storage_t *__range2;
  dictionary_t *copy_local;
  dictionary_t *this_local;
  
  if (this != copy) {
    __end2 = std::
             unordered_map<deci::value_t_*,_deci::value_t_*,_deci::value_hash_t,_deci::value_equal_to_t,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>_>
             ::begin(&this->storage);
    el.second = (value_t *)
                std::
                unordered_map<deci::value_t_*,_deci::value_t_*,_deci::value_hash_t,_deci::value_equal_to_t,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>_>
                ::end(&this->storage);
    while (bVar1 = std::__detail::operator!=
                             (&__end2.
                               super__Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true>
                              ,(_Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true>
                                *)&el.second), bVar1) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<deci::value_t_*const,_deci::value_t_*>,_false,_true>::
               operator*(&__end2);
      el.first = ppVar3->second;
      (*ppVar3->first->_vptr_value_t[3])();
      (*(el.first)->_vptr_value_t[3])();
      std::__detail::_Node_iterator<std::pair<deci::value_t_*const,_deci::value_t_*>,_false,_true>::
      operator++(&__end2);
    }
    std::
    unordered_map<deci::value_t_*,_deci::value_t_*,_deci::value_hash_t,_deci::value_equal_to_t,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>_>
    ::clear(&this->storage);
    __n = std::
          unordered_map<deci::value_t_*,_deci::value_t_*,_deci::value_hash_t,_deci::value_equal_to_t,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>_>
          ::size(&copy->storage);
    std::
    unordered_map<deci::value_t_*,_deci::value_t_*,_deci::value_hash_t,_deci::value_equal_to_t,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>_>
    ::reserve(&this->storage,__n);
    __end2_1 = std::
               unordered_map<deci::value_t_*,_deci::value_t_*,_deci::value_hash_t,_deci::value_equal_to_t,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>_>
               ::begin(&copy->storage);
    el_1.second = (value_t *)
                  std::
                  unordered_map<deci::value_t_*,_deci::value_t_*,_deci::value_hash_t,_deci::value_equal_to_t,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>_>
                  ::end(&copy->storage);
    while (bVar1 = std::__detail::operator!=
                             (&__end2_1.
                               super__Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true>
                              ,(_Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true>
                                *)&el_1.second), bVar1) {
      pvVar4 = std::__detail::
               _Node_const_iterator<std::pair<deci::value_t_*const,_deci::value_t_*>,_false,_true>::
               operator*(&__end2_1);
      key = pvVar4->first;
      el_1.first = pvVar4->second;
      iVar2 = (*key->_vptr_value_t[2])();
      value = (value_t *)CONCAT44(extraout_var,iVar2);
      iVar2 = (*(el_1.first)->_vptr_value_t[2])();
      local_78 = (value_t *)CONCAT44(extraout_var_00,iVar2);
      local_88 = std::make_pair<deci::value_t*&,deci::value_t*&>(&value,&local_78);
      std::
      unordered_map<deci::value_t*,deci::value_t*,deci::value_hash_t,deci::value_equal_to_t,std::allocator<std::pair<deci::value_t*const,deci::value_t*>>>
      ::insert<std::pair<deci::value_t*,deci::value_t*>>
                ((unordered_map<deci::value_t*,deci::value_t*,deci::value_hash_t,deci::value_equal_to_t,std::allocator<std::pair<deci::value_t*const,deci::value_t*>>>
                  *)&this->storage,&local_88);
      std::__detail::
      _Node_const_iterator<std::pair<deci::value_t_*const,_deci::value_t_*>,_false,_true>::
      operator++(&__end2_1);
    }
  }
  return this;
}

Assistant:

dictionary_t& dictionary_t::operator = (const dictionary_t& copy) {
    if (this != &copy) {
      for (auto el: this->storage) {
        el.first->Delete();
        el.second->Delete();
      }
      this->storage.clear();

      this->storage.reserve(copy.storage.size());
      for (auto el: copy.storage) {
        value_t* key = el.first->Copy();
        value_t* value = el.second->Copy();
        this->storage.insert(std::make_pair(key,value));
      }
    }
    return *this;
  }